

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtReadHexNumber(word *pTruth,char *pString)

{
  int iVar1;
  int local_24;
  int nDigits;
  int Digit;
  int k;
  char *pString_local;
  word *pTruth_local;
  
  local_24 = 0;
  nDigits = 0;
  while( true ) {
    iVar1 = Abc_TtIsHexDigit(pString[nDigits]);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
    nDigits = nDigits + 1;
  }
  nDigits = 0;
  while( true ) {
    if (local_24 <= nDigits) {
      return local_24;
    }
    iVar1 = Abc_TtReadHexDigit(pString[(local_24 + -1) - nDigits]);
    if ((iVar1 < 0) || (0xf < iVar1)) break;
    Abc_TtSetHex(pTruth,nDigits,iVar1);
    nDigits = nDigits + 1;
  }
  __assert_fail("Digit >= 0 && Digit < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x53c,"int Abc_TtReadHexNumber(word *, char *)");
}

Assistant:

static inline int Abc_TtReadHexNumber( word * pTruth, char * pString )
{
    // count the number of hex digits
    int k, Digit, nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    return nDigits;
}